

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void CalcWindowContentSizes
               (ImGuiWindow *window,ImVec2 *content_size_current,ImVec2 *content_size_ideal)

{
  bool bVar1;
  float fVar2;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  bool preserve_old_content_sizes;
  ImVec2 *content_size_ideal_local;
  ImVec2 *content_size_current_local;
  ImGuiWindow *window_local;
  
  bVar1 = false;
  if ((((window->Collapsed & 1U) == 0) || ('\0' < window->AutoFitFramesX)) ||
     ('\0' < window->AutoFitFramesY)) {
    if ((((window->Hidden & 1U) != 0) && (window->HiddenFramesCannotSkipItems == '\0')) &&
       ('\0' < window->HiddenFramesCanSkipItems)) {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    *content_size_current = window->ContentSize;
    *content_size_ideal = window->ContentSizeIdeal;
  }
  else {
    fVar2 = (window->ContentSizeExplicit).x;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_28 = (window->ContentSizeExplicit).x;
    }
    else {
      local_28 = (float)(int)((window->DC).CursorMaxPos.x - (window->DC).CursorStartPos.x);
    }
    content_size_current->x = local_28;
    fVar2 = (window->ContentSizeExplicit).y;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_2c = (window->ContentSizeExplicit).y;
    }
    else {
      local_2c = (float)(int)((window->DC).CursorMaxPos.y - (window->DC).CursorStartPos.y);
    }
    content_size_current->y = local_2c;
    fVar2 = (window->ContentSizeExplicit).x;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_30 = (window->ContentSizeExplicit).x;
    }
    else {
      fVar2 = ImMax<float>((window->DC).CursorMaxPos.x,(window->DC).IdealMaxPos.x);
      local_30 = (float)(int)(fVar2 - (window->DC).CursorStartPos.x);
    }
    content_size_ideal->x = local_30;
    fVar2 = (window->ContentSizeExplicit).y;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      local_34 = (window->ContentSizeExplicit).y;
    }
    else {
      fVar2 = ImMax<float>((window->DC).CursorMaxPos.y,(window->DC).IdealMaxPos.y);
      local_34 = (float)(int)(fVar2 - (window->DC).CursorStartPos.y);
    }
    content_size_ideal->y = local_34;
  }
  return;
}

Assistant:

static void CalcWindowContentSizes(ImGuiWindow* window, ImVec2* content_size_current, ImVec2* content_size_ideal)
{
    bool preserve_old_content_sizes = false;
    if (window->Collapsed && window->AutoFitFramesX <= 0 && window->AutoFitFramesY <= 0)
        preserve_old_content_sizes = true;
    else if (window->Hidden && window->HiddenFramesCannotSkipItems == 0 && window->HiddenFramesCanSkipItems > 0)
        preserve_old_content_sizes = true;
    if (preserve_old_content_sizes)
    {
        *content_size_current = window->ContentSize;
        *content_size_ideal = window->ContentSizeIdeal;
        return;
    }

    content_size_current->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(window->DC.CursorMaxPos.x - window->DC.CursorStartPos.x);
    content_size_current->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(window->DC.CursorMaxPos.y - window->DC.CursorStartPos.y);
    content_size_ideal->x = (window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : IM_FLOOR(ImMax(window->DC.CursorMaxPos.x, window->DC.IdealMaxPos.x) - window->DC.CursorStartPos.x);
    content_size_ideal->y = (window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : IM_FLOOR(ImMax(window->DC.CursorMaxPos.y, window->DC.IdealMaxPos.y) - window->DC.CursorStartPos.y);
}